

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O1

void __thiscall vectorgraphics::TikzPlotter::addPoint(TikzPlotter *this,Point2D *point_2d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer psVar3;
  Style *this_00;
  TikzPlotter *pTVar4;
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  long lVar8;
  long *plVar9;
  pointer psVar10;
  long *plVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  StyleMap style_map;
  allocator_type local_212;
  allocator_type local_211;
  TikzPlotter *local_210;
  string local_208;
  string local_1e8;
  key_type local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  key_type local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68 [2];
  long local_58 [2];
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_48;
  
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8._M_impl.super__Rb_tree_header._M_header;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar10 = (point_2d->super_Primitive).style_ptrs.
            super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (point_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_210 = this;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (psVar10 != psVar3) {
    do {
      this_00 = (psVar10->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::vector(&local_48,
               (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
                *)point_2d);
      bVar5 = Style::conditionFulfilled(this_00,&local_48);
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::~vector(&local_48);
      if (bVar5) {
        Style::applyStyle((psVar10->
                          super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,(StyleMap *)&local_1a8);
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar3);
  }
  paVar1 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"draw","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_1a8,&local_148);
  pTVar4 = local_210;
  p_Var2 = &local_1a8._M_impl.super__Rb_tree_header;
  bVar5 = true;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var2) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"fill","");
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_1a8,&local_1c8);
    bVar5 = (_Rb_tree_header *)iVar6._M_node != p_Var2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTVar4->field_0x10,"\\path[",6);
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"draw","");
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"draw opacity","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"fill","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"fill opacity","");
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"line width","");
    plVar9 = local_98;
    local_a8[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"*point_path","");
    __l._M_len = 6;
    __l._M_array = &local_148;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_160,__l,&local_211);
    getStyleMapString(&local_1e8,(StyleMap *)&local_1a8,&local_160);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&pTVar4->field_0x10,local_1e8._M_dataplus._M_p,
                        local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    poVar7 = operator<<(poVar7,point_2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"circle [",8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"radius","");
    plVar11 = local_58;
    local_68[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"*point_circle","");
    __l_00._M_len = 2;
    __l_00._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178,__l_00,&local_212);
    getStyleMapString(&local_208,(StyleMap *)&local_1a8,&local_178);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    lVar8 = -0x40;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    lVar8 = -0xc0;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1a8);
  return;
}

Assistant:

void TikzPlotter::addPoint(const Point2D &point_2d) {
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : point_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(point_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the point based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "*point_path"})
        << "] " 
        << point_2d 
        << "circle [" 
        << getStyleMapString(style_map, {"radius", "*point_circle"})
        << "];" 
        << std::endl;
    }
  }